

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__decode_uint16_linear_scaled(float *decodep,int width_times_channels,void *inputp)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  float *pfVar10;
  bool bVar11;
  __m128i zero;
  __m128 of1;
  __m128 of0;
  __m128i o1;
  __m128i o0;
  __m128i i;
  unsigned_short *end_input_m8;
  unsigned_short *input;
  float *decode_end;
  float *decode;
  void *inputp_local;
  int width_times_channels_local;
  float *decodep_local;
  ushort local_a8;
  ushort uStack_a6;
  ushort uStack_a4;
  ushort uStack_a2;
  ushort uStack_70;
  ushort uStack_6e;
  ushort uStack_6c;
  ushort uStack_6a;
  uint uStack_64;
  uint uStack_5c;
  uint uStack_54;
  uint uStack_4c;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  pfVar10 = decodep + width_times_channels;
  if (width_times_channels < 8) {
    end_input_m8 = (unsigned_short *)inputp;
    for (decode_end = decodep + 4; decode_end <= pfVar10; decode_end = decode_end + 4) {
      decode_end[-4] = (float)*end_input_m8 * 1.5259022e-05;
      decode_end[-3] = (float)end_input_m8[1] * 1.5259022e-05;
      decode_end[-2] = (float)end_input_m8[2] * 1.5259022e-05;
      decode_end[-1] = (float)end_input_m8[3] * 1.5259022e-05;
      end_input_m8 = end_input_m8 + 4;
    }
    for (decode_end = decode_end + -4; decode_end < pfVar10; decode_end = decode_end + 1) {
      *decode_end = (float)*end_input_m8 * 1.5259022e-05;
      end_input_m8 = end_input_m8 + 1;
    }
  }
  else {
    end_input_m8 = (unsigned_short *)inputp;
    decode_end = decodep;
    do {
      do {
        uVar2 = *(undefined8 *)end_input_m8;
        uVar5 = *(undefined8 *)(end_input_m8 + 4);
        local_a8 = (ushort)uVar2;
        uStack_a6 = (ushort)((ulong)uVar2 >> 0x10);
        uStack_a4 = (ushort)((ulong)uVar2 >> 0x20);
        uStack_a2 = (ushort)((ulong)uVar2 >> 0x30);
        uStack_70 = (ushort)uVar5;
        uStack_6e = (ushort)((ulong)uVar5 >> 0x10);
        uStack_6c = (ushort)((ulong)uVar5 >> 0x20);
        uStack_6a = (ushort)((ulong)uVar5 >> 0x30);
        uStack_54 = (uint)uStack_a6;
        uStack_4c = (uint)uStack_a2;
        uVar2 = CONCAT26((short)((uint)(float)uStack_54 >> 0x10),
                         CONCAT24(SUB42((float)uStack_54,0),(float)local_a8));
        auVar3._8_2_ = SUB42((float)uStack_a4,0);
        auVar3._0_8_ = uVar2;
        auVar3._10_2_ = (short)((uint)(float)uStack_a4 >> 0x10);
        auVar1._12_2_ = SUB42((float)uStack_4c,0);
        auVar1._0_12_ = auVar3;
        auVar1._14_2_ = (short)((uint)(float)uStack_4c >> 0x10);
        uStack_64 = (uint)uStack_6e;
        uStack_5c = (uint)uStack_6a;
        uVar5 = CONCAT26((short)((uint)(float)uStack_64 >> 0x10),
                         CONCAT24(SUB42((float)uStack_64,0),(float)uStack_70));
        auVar6._8_2_ = SUB42((float)uStack_6c,0);
        auVar6._0_8_ = uVar5;
        auVar6._10_2_ = (short)((uint)(float)uStack_6c >> 0x10);
        auVar4._12_2_ = SUB42((float)uStack_5c,0);
        auVar4._0_12_ = auVar6;
        auVar4._14_2_ = (short)((uint)(float)uStack_5c >> 0x10);
        fStack_14 = (float)((ulong)uVar2 >> 0x20);
        fStack_10 = auVar3._8_4_;
        fStack_c = auVar1._12_4_;
        uVar9 = CONCAT26((short)((uint)(fStack_14 * 1.5259022e-05) >> 0x10),
                         CONCAT24(SUB42(fStack_14 * 1.5259022e-05,0),(float)local_a8 * 1.5259022e-05
                                 ));
        auVar8._8_2_ = SUB42(fStack_10 * 1.5259022e-05,0);
        auVar8._0_8_ = uVar9;
        auVar8._10_2_ = (short)((uint)(fStack_10 * 1.5259022e-05) >> 0x10);
        auVar8._12_2_ = SUB42(fStack_c * 1.5259022e-05,0);
        auVar8._14_2_ = (short)((uint)(fStack_c * 1.5259022e-05) >> 0x10);
        fStack_34 = (float)((ulong)uVar5 >> 0x20);
        fStack_30 = auVar6._8_4_;
        fStack_2c = auVar4._12_4_;
        uVar2 = CONCAT26((short)((uint)(fStack_34 * 1.5259022e-05) >> 0x10),
                         CONCAT24(SUB42(fStack_34 * 1.5259022e-05,0),
                                  (float)uStack_70 * 1.5259022e-05));
        auVar7._8_2_ = SUB42(fStack_30 * 1.5259022e-05,0);
        auVar7._0_8_ = uVar2;
        auVar7._10_2_ = (short)((uint)(fStack_30 * 1.5259022e-05) >> 0x10);
        auVar7._12_2_ = SUB42(fStack_2c * 1.5259022e-05,0);
        auVar7._14_2_ = (short)((uint)(fStack_2c * 1.5259022e-05) >> 0x10);
        of0._0_8_ = auVar8._8_8_;
        *(undefined8 *)decode_end = uVar9;
        *(undefined8 *)(decode_end + 2) = of0._0_8_;
        of1._0_8_ = auVar7._8_8_;
        *(undefined8 *)(decode_end + 4) = uVar2;
        *(undefined8 *)(decode_end + 6) = of1._0_8_;
        decode_end = decode_end + 8;
        end_input_m8 = end_input_m8 + 8;
      } while (decode_end <= pfVar10 + -8);
      bVar11 = decode_end != pfVar10;
      end_input_m8 = (unsigned_short *)((long)inputp + (long)width_times_channels * 2 + -0x10);
      decode_end = pfVar10 + -8;
    } while (bVar11);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint16_linear_scaled)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned short const * input = (unsigned short const *)inputp;

  #ifdef STBIR_SIMD
  unsigned short const * end_input_m8 = input + width_times_channels - 8;
  if ( width_times_channels >= 8 )
  {
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o;
      stbir__simdf8 of;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u16_to_u32( o, i );
      stbir__simdi8_convert_i32_to_float( of, o );
      stbir__simdf8_mult( of, of, STBIR_max_uint16_as_float_inverted8);
      stbir__decode_simdf8_flip( of );
      stbir__simdf8_store( decode + 0, of );
      #else
      stbir__simdi i, o0, o1;
      stbir__simdf of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u16_to_u32( o0,o1,i );
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__simdf_mult( of0, of0, STBIR__CONSTF(STBIR_max_uint16_as_float_inverted) );
      stbir__simdf_mult( of1, of1, STBIR__CONSTF(STBIR_max_uint16_as_float_inverted));
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0])) * stbir__max_uint16_as_float_inverted;
    decode[1-4] = ((float)(input[stbir__decode_order1])) * stbir__max_uint16_as_float_inverted;
    decode[2-4] = ((float)(input[stbir__decode_order2])) * stbir__max_uint16_as_float_inverted;
    decode[3-4] = ((float)(input[stbir__decode_order3])) * stbir__max_uint16_as_float_inverted;
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0])) * stbir__max_uint16_as_float_inverted;
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1])) * stbir__max_uint16_as_float_inverted;
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2])) * stbir__max_uint16_as_float_inverted;
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}